

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O3

MetricInfo __thiscall
xLearn::Trainer::calc_metric
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *reader_list)

{
  Reader *pRVar1;
  Metric *pMVar2;
  uint uVar3;
  pointer ppRVar4;
  ostream *poVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  vector<float,_std::allocator<float>_> pred;
  DMatrix *matrix;
  Logger local_7c;
  string local_78;
  string local_58;
  undefined1 local_38 [16];
  
  if ((reader_list->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl
      .super__Vector_impl_data._M_start !=
      (reader_list->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl
      .super__Vector_impl_data._M_finish) {
    local_78._0_16_ = ZEXT816(0) << 0x40;
    auVar8 = ZEXT1664((undefined1  [16])local_78._0_16_);
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_78.field_2._M_allocated_capacity = 0;
    if (this->metric_ != (Metric *)0x0) {
      (*this->metric_->_vptr_Metric[3])();
    }
    (*this->loss_->_vptr_Loss[7])();
    auVar7 = auVar8._0_16_;
    ppRVar4 = (reader_list->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if ((reader_list->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppRVar4) {
      uVar6 = 0;
      do {
        (*ppRVar4[uVar6]->_vptr_Reader[5])();
        while( true ) {
          pRVar1 = (reader_list->
                   super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar6];
          uVar3 = (*pRVar1->_vptr_Reader[4])(pRVar1,&local_58);
          auVar7 = auVar8._0_16_;
          if (uVar3 == 0) break;
          if ((long)(local_78._M_string_length - (long)local_78._M_dataplus._M_p) >> 2 !=
              (ulong)uVar3) {
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)&local_78,(ulong)uVar3);
          }
          (*this->loss_->_vptr_Loss[3])
                    (this->loss_,local_58._M_dataplus._M_p,this->model_,
                     (vector<float,_std::allocator<float>_> *)&local_78);
          (*this->loss_->_vptr_Loss[2])
                    (this->loss_,(vector<float,_std::allocator<float>_> *)&local_78,
                     local_58._M_dataplus._M_p + 0x30);
          pMVar2 = this->metric_;
          if (pMVar2 != (Metric *)0x0) {
            (*pMVar2->_vptr_Metric[2])
                      (pMVar2,local_58._M_dataplus._M_p + 0x30,
                       (vector<float,_std::allocator<float>_> *)&local_78);
          }
        }
        ppRVar4 = (reader_list->
                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)(reader_list->
                                     super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar4 >>
                              3));
    }
    (*this->loss_->_vptr_Loss[6])();
    if (this->metric_ != (Metric *)0x0) {
      local_38 = auVar7;
      (*this->metric_->_vptr_Metric[4])();
      auVar7 = vinsertps_avx(local_38,auVar7,0x10);
    }
    local_38._0_8_ = auVar7._0_8_;
    if ((pointer)local_78._M_dataplus._M_p != (pointer)0x0) {
      local_38 = auVar7;
      operator_delete(local_78._M_dataplus._M_p);
    }
    return (MetricInfo)local_38._0_8_;
  }
  local_7c.severity_ = ERR;
  local_78._M_string_length = (size_type)local_78._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)((long)&local_78 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/trainer.cc"
             ,"");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"calc_metric","");
  poVar5 = Logger::Start(ERR,&local_78,0x10e,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK_NE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/trainer.cc"
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x10e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"reader_list.empty()",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"true",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  Logger::~Logger(&local_7c);
  abort();
}

Assistant:

MetricInfo Trainer::calc_metric(std::vector<Reader*>& reader_list) {
  CHECK_NE(reader_list.empty(), true);
  DMatrix* matrix = nullptr;
  std::vector<real_t> pred;
  if (metric_ != nullptr) {
    metric_->Reset();
  }
  loss_->Reset();
  for (int i = 0; i < reader_list.size(); ++i) {
    reader_list[i]->Reset();
    for (;;) {
      index_t tmp = reader_list[i]->Samples(matrix);
      if (tmp == 0) { break; }
      if (tmp != pred.size()) { pred.resize(tmp); }
      loss_->Predict(matrix, *model_, pred);
      loss_->Evaluate(pred, matrix->Y);
      if (metric_ != nullptr) {
        metric_->Accumulate(matrix->Y, pred);
      }
    }
  }
  MetricInfo info;
  info.loss_val = loss_->GetLoss();
  if (metric_ != nullptr) {
    info.metric_val = metric_->GetMetric();
  }
  return info;
}